

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SourceDynamicProfileManager.h
# Opt level: O3

void __thiscall
Js::SourceDynamicProfileManager::SourceDynamicProfileManager
          (SourceDynamicProfileManager *this,Recycler *allocator)

{
  this->recycler = allocator;
  (this->dynamicProfileInfoMapSaving).buckets = (Type)0x0;
  (this->dynamicProfileInfoMapSaving).entries = (Type)0x0;
  (this->dynamicProfileInfoMapSaving).alloc = &Memory::HeapAllocator::Instance;
  (this->dynamicProfileInfoMapSaving).size = 0;
  (this->dynamicProfileInfoMapSaving).bucketCount = 0;
  (this->dynamicProfileInfoMapSaving).count = 0;
  (this->dynamicProfileInfoMapSaving).freeCount = 0;
  (this->dynamicProfileInfoMapSaving).modFunctionIndex = 0x4b;
  (this->dynamicProfileInfoMapSaving).stats = (Type)0x0;
  this->isNonCachableScript = false;
  (this->dataCacheWrapper).ptr = (SimpleDataCacheWrapper *)0x0;
  (this->startupFunctions).ptr = (BVFixed *)0x0;
  (this->cachedStartupFunctions).ptr = (BVFixed *)0x0;
  JsUtil::
  BaseDictionary<unsigned_int,_Js::DynamicProfileInfo_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  ::BaseDictionary(&this->dynamicProfileInfoMap,allocator,0);
  return;
}

Assistant:

SourceDynamicProfileManager(Recycler* allocator) : isNonCachableScript(false), cachedStartupFunctions(nullptr), recycler(allocator),
#ifdef DYNAMIC_PROFILE_STORAGE
            dynamicProfileInfoMapSaving(&HeapAllocator::Instance),
#endif
            dynamicProfileInfoMap(allocator), startupFunctions(nullptr), dataCacheWrapper(nullptr) 
        {
        }